

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.cc
# Opt level: O2

t_pvalue * __thiscall xemmai::t_context::f_variable(t_context *this,wstring_view a_name)

{
  const_iterator cVar1;
  long lVar2;
  t_object *ptVar3;
  t_pvalue *ptVar4;
  ulong uVar5;
  ulong uVar6;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_28;
  
  local_28._M_str = a_name._M_str;
  local_28._M_len = a_name._M_len;
  ptVar3 = this->v_lambda;
  lVar2 = *(long *)(ptVar3->v_data + 8);
  cVar1 = std::
          _Rb_tree<std::__cxx11::wstring,std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>,std::_Select1st<std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>>,std::less<void>,std::allocator<std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>>>
          ::_M_find_tr<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,void>
                    ((_Rb_tree<std::__cxx11::wstring,std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>,std::_Select1st<std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>>,std::less<void>,std::allocator<std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>>>
                      *)(lVar2 + 0xb0),&local_28);
  if (cVar1._M_node == (_Base_ptr)(lVar2 + 0xb8)) {
    return (t_pvalue *)0x0;
  }
  lVar2 = local_28._M_len << 2;
  for (uVar6 = 0;
      (uVar5 = local_28._M_len & 0x3fffffffffffffff, lVar2 != 0 &&
      (uVar5 = uVar6, local_28._M_str[uVar6] == L':')); uVar6 = uVar6 + 1) {
    lVar2 = lVar2 + -4;
  }
  if (uVar5 == 0) {
    if ((char)cVar1._M_node[2]._M_color != _S_black) {
      ptVar4 = this->v_base;
      goto LAB_00147fc5;
    }
    ptVar3 = this->v_scope;
  }
  else {
    ptVar3 = *(t_object **)ptVar3->v_data;
    while (uVar5 = uVar5 - 1, uVar5 != 0) {
      ptVar3 = *(t_object **)(ptVar3->v_data + 8);
    }
  }
  ptVar4 = (t_pvalue *)(ptVar3->v_data + 0x10);
LAB_00147fc5:
  return ptVar4 + (long)cVar1._M_node[2]._M_parent;
}

Assistant:

const t_pvalue* t_context::f_variable(std::wstring_view a_name) const
{
	auto& lambda = v_lambda->f_as<t_lambda>();
	auto& code = lambda.v_code->f_as<t_code>();
	auto i = code.v_variables.find(a_name);
	if (i == code.v_variables.end()) return nullptr;
	size_t outer = 0;
	for (auto i = a_name.begin(); i != a_name.end() && *i == L':'; ++i) ++outer;
	size_t index = i->second.v_index;
	if (outer <= 0) return (i->second.v_shared ? reinterpret_cast<const t_pvalue*>(v_scope->f_as<t_scope>().f_entries()) : v_base) + index;
	t_object* scope = lambda.v_scope;
	for (size_t i = 1; i < outer; ++i) scope = scope->f_as<t_scope>().f_outer();
	return reinterpret_cast<const t_pvalue*>(scope->f_as<t_scope>().f_entries()) + index;
}